

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O1

int plugin_manager_clear(plugin_manager manager,plugin p)

{
  char *key;
  set_value pvVar1;
  int iVar2;
  
  if (p == (plugin)0x0) {
    iVar2 = 1;
  }
  else {
    key = plugin_name(p);
    pvVar1 = set_get(manager->plugins,key);
    iVar2 = 0;
    if (pvVar1 != (set_value)0x0) {
      pvVar1 = set_remove(manager->plugins,key);
      iVar2 = 0;
      if (pvVar1 == (set_value)0x0) {
        log_write_impl_va("metacall",0x116,"plugin_manager_unregister",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                          ,LOG_LEVEL_ERROR,"Failed to unregister plugin %s from manager %s",key,
                          manager->name);
        iVar2 = 1;
      }
    }
    plugin_destroy(p);
  }
  return iVar2;
}

Assistant:

int plugin_manager_clear(plugin_manager manager, plugin p)
{
	if (p == NULL)
	{
		return 1;
	}

	/* Remove the plugin from the plugins set */
	int result = plugin_manager_unregister(manager, p);

	/* Unload the dynamic link library and destroy the plugin */
	plugin_destroy(p);

	return result;
}